

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMan.c
# Opt level: O3

void Amap_ManStop(Amap_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *__ptr;
  int *__ptr_00;
  
  pVVar1 = p->vPis;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPos;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vObjs;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCuts0;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCuts1;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCuts2;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTempP;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr = p->vTemp;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  Aig_MmFixedStop(p->pMemObj,0);
  Aig_MmFlexStop(p->pMemCuts,0);
  Aig_MmFlexStop(p->pMemCutBest,0);
  Aig_MmFlexStop(p->pMemTemp,0);
  if (p->pMatsTemp != (int *)0x0) {
    free(p->pMatsTemp);
    p->pMatsTemp = (int *)0x0;
  }
  if (p->ppCutsTemp != (Amap_Cut_t **)0x0) {
    free(p->ppCutsTemp);
    p->ppCutsTemp = (Amap_Cut_t **)0x0;
  }
  if (p->pCutsPi != (Amap_Cut_t *)0x0) {
    free(p->pCutsPi);
  }
  free(p);
  return;
}

Assistant:

void Amap_ManStop( Amap_Man_t * p )
{
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vCuts0 );
    Vec_PtrFree( p->vCuts1 );
    Vec_PtrFree( p->vCuts2 );
    Vec_PtrFree( p->vTempP );
    Vec_IntFree( p->vTemp );
    Aig_MmFixedStop( p->pMemObj, 0 );
    Aig_MmFlexStop( p->pMemCuts, 0 );
    Aig_MmFlexStop( p->pMemCutBest, 0 );
    Aig_MmFlexStop( p->pMemTemp, 0 );
    ABC_FREE( p->pMatsTemp );
    ABC_FREE( p->ppCutsTemp );
    ABC_FREE( p->pCutsPi );
    ABC_FREE( p );
}